

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool is_label)

{
  char *pcVar1;
  undefined7 in_register_00000081;
  string *in_R9;
  string_view name_00;
  string_view sVar2;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = name._M_str;
  sVar2._M_str = (anon_unknown_0 *)name._M_len;
  sVar2._M_len = (size_t)pcVar1;
  sVar2 = anon_unknown_0::StripLeadingDollar(sVar2._M_str,sVar2);
  name_00._M_len = sVar2._M_str;
  name_00._M_str = pcVar1;
  MangleName_abi_cxx11_(&local_70,(CWriter *)sVar2._M_len,name_00);
  std::operator+(&local_50,"w2c_",&local_70);
  anon_unknown_0::CWriter::ClaimUniqueName
            (__return_storage_ptr__,(CWriter *)(this + 0x150),(SymbolSet *)(this + 0x90),
             (SymbolMap *)(ulong)((uint)CONCAT71(in_register_00000081,is_label) | 0x6c),
             (char)&local_50,name,in_R9);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::DefineLocalScopeName(std::string_view name,
                                          bool is_label) {
  return ClaimUniqueName(local_syms_, local_sym_map_,
                         is_label ? kLabelSuffix : kParamSuffix, name,
                         kSymbolPrefix + MangleName(StripLeadingDollar(name)));
}